

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O2

bool __thiscall
bssl::VerifySerialNumber(bssl *this,Input value,bool warnings_only,CertErrors *errors)

{
  bool bVar1;
  uint8_t uVar2;
  undefined7 in_register_00000009;
  CertErrors *this_00;
  Input in;
  bool negative;
  char local_41;
  CertErrorParams *local_40;
  _Head_base<0UL,_bssl::CertErrorParams_*,_false> local_38;
  Input local_30;
  
  this_00 = (CertErrors *)CONCAT71(in_register_00000009,warnings_only);
  in.data_.data_ = value.data_.data_;
  in.data_.size_ = (size_t)&local_41;
  local_30.data_.data_ = (uchar *)this;
  local_30.data_.size_ = (size_t)in.data_.data_;
  bVar1 = der::IsValidInteger((der *)this,in,(bool *)this_00);
  if (bVar1) {
    if (local_41 == '\x01') {
      CertErrors::AddWarning(this_00,"Serial number is negative");
    }
    if ((in.data_.data_ == (uchar *)0x1) &&
       (uVar2 = der::Input::operator[](&local_30,0), in.data_.data_ = (uchar *)local_30.data_.size_,
       uVar2 == '\0')) {
      CertErrors::AddWarning(this_00,"Serial number is zero");
      in.data_.data_ = (uchar *)local_30.data_.size_;
    }
    if (in.data_.data_ < (uchar *)0x15) {
      return true;
    }
    CreateCertErrorParams1SizeT((bssl *)&local_40,"length",(size_t)in.data_.data_);
    CertErrors::Add(this_00,(Severity)value.data_.size_,"Serial number is longer than 20 octets",
                    (unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>
                     *)&local_40);
  }
  else {
    local_38._M_head_impl = (CertErrorParams *)0x0;
    CertErrors::Add(this_00,(Severity)value.data_.size_,"Serial number is not a valid INTEGER",
                    (unique_ptr<bssl::CertErrorParams,_std::default_delete<bssl::CertErrorParams>_>
                     *)&local_38);
    local_40 = local_38._M_head_impl;
  }
  if (local_40 != (CertErrorParams *)0x0) {
    (*local_40->_vptr_CertErrorParams[1])();
  }
  return false;
}

Assistant:

bool VerifySerialNumber(der::Input value, bool warnings_only,
                        CertErrors *errors) {
  // If |warnings_only| was set to true, the exact same errors will be logged,
  // only they will be logged with a lower severity (warning rather than error).
  CertError::Severity error_severity =
      warnings_only ? CertError::SEVERITY_WARNING : CertError::SEVERITY_HIGH;

  bool negative;
  if (!der::IsValidInteger(value, &negative)) {
    errors->Add(error_severity, kSerialNumberNotValidInteger, nullptr);
    return false;
  }

  // RFC 5280 section 4.1.2.2:
  //
  //    Note: Non-conforming CAs may issue certificates with serial numbers
  //    that are negative or zero.  Certificate users SHOULD be prepared to
  //    gracefully handle such certificates.
  if (negative) {
    errors->AddWarning(kSerialNumberIsNegative);
  }
  if (value.size() == 1 && value[0] == 0) {
    errors->AddWarning(kSerialNumberIsZero);
  }

  // RFC 5280 section 4.1.2.2:
  //
  //    Certificate users MUST be able to handle serialNumber values up to 20
  //    octets. Conforming CAs MUST NOT use serialNumber values longer than 20
  //    octets.
  if (value.size() > 20) {
    errors->Add(error_severity, kSerialNumberLengthOver20,
                CreateCertErrorParams1SizeT("length", value.size()));
    return false;
  }

  return true;
}